

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makewff.c
# Opt level: O2

void generate_wff(void)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int cl [1000];
  
  if (style == 2) {
    printf("%d %d\n",(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  else if (style == 0) {
    printf("c seed= %u\np cnf %d %d\n",(ulong)seed,(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  iVar4 = 1;
  do {
    if (nclauses < iVar4) {
      if (style == 1) {
        printf("%%\n0\n");
        return;
      }
      return;
    }
    for (lVar6 = 0; uVar2 = (ulong)clen, lVar6 < (long)uVar2; lVar6 = lVar6 + 1) {
      do {
        lVar3 = random();
        bVar1 = false;
        iVar5 = (int)(lVar3 % (long)nvars) + 1;
        for (lVar3 = 0; lVar6 != lVar3; lVar3 = lVar3 + 1) {
          if (iVar5 == cl[lVar3]) {
            bVar1 = true;
          }
        }
      } while (bVar1);
      cl[lVar6] = iVar5;
    }
    for (uVar7 = 0; (long)uVar7 < (long)(int)uVar2; uVar7 = uVar7 + 1) {
      iVar5 = flip();
      if (iVar5 != 0) {
        cl[uVar7] = -cl[uVar7];
      }
      uVar2 = (ulong)(uint)clen;
    }
    if (style == 2) {
      printf("%d",uVar7 & 0xffffffff);
      for (lVar6 = 0; lVar6 < clen; lVar6 = lVar6 + 1) {
        printf(" %d",(ulong)(uint)cl[lVar6]);
      }
LAB_00101441:
      putchar(10);
    }
    else {
      if (style == 1) {
        printf("%d",(ulong)(uint)cl[0]);
        for (lVar6 = 1; lVar6 < clen; lVar6 = lVar6 + 1) {
          printf(" %d",(ulong)(uint)cl[lVar6]);
        }
        goto LAB_00101441;
      }
      if (style == 0) {
        for (lVar6 = 0; lVar6 < (int)uVar2; lVar6 = lVar6 + 1) {
          printf("%d ",(ulong)(uint)cl[lVar6]);
          uVar2 = (ulong)(uint)clen;
        }
        puts("0");
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void generate_wff()
{
    int i, j, k;
    int cl[MAX_CLEN];
    int lit;
    int dup;

    if (style == CNF_style) {
        printf("c seed= %u\np cnf %d %d\n", seed, nvars, nclauses);
    } else if (style == KF_style) {
        printf("%d %d\n", nvars, nclauses);
    }

    for (i = 1; i <= nclauses; i++) {
        for (j = 0; j < clen; j++) {
            do {
                lit = random() % nvars + 1;
                dup = FALSE;
                for (k = 0; k < j; k++)
                    if (lit == cl[k])
                        dup = TRUE;
            } while (dup);
            cl[j] = lit;
        }
        for (j = 0; j < clen; j++)
            if (flip())
                cl[j] *= -1;

        if (style == CNF_style) {
            for (j = 0; j < clen; j++)
                printf("%d ", cl[j]);
            printf("0\n");
        } else if (style == F_style) {
            printf("%d", cl[0]);
            for (j = 1; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        } else if (style == KF_style) {
            printf("%d", j);
            for (j = 0; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        }
    }

    if (style == F_style) {
        printf("%%\n0\n");
    }
}